

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessCommDatasetJob
          (Value *__return_storage_ptr__,Interpreter *this,CommissionerAppPtr *aCommissioner,
          Expression *aExpr)

{
  ErrorCode EVar1;
  pointer pbVar2;
  element_type *peVar3;
  bool bVar4;
  Value *pVVar5;
  char *pcVar6;
  char *pcVar7;
  CommissionerDataset *aDataset;
  string *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string *this_01;
  string_view fmt;
  format_args args;
  format_args args_00;
  format_args args_01;
  CommissionerDataset dataset;
  Value local_1e8;
  format_string_checker<char> local_198;
  string local_160;
  string local_140;
  Error local_120;
  undefined1 local_f8 [40];
  undefined1 local_d0 [40];
  undefined1 local_a8 [40];
  undefined1 local_80 [40];
  undefined1 local_58 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  pbVar2 = (aExpr->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(aExpr->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x21) {
    local_1e8.mError._0_8_ = local_1e8.mError._0_8_ & 0xffffffff00000000;
    local_1e8.mError.mMessage._M_dataplus._M_p = "too few arguments";
    local_1e8.mError.mMessage._M_string_length = 0x11;
    local_1e8.mError.mMessage.field_2._M_allocated_capacity = 0;
    local_1e8.mData._M_dataplus._M_p = (pointer)0x0;
    pcVar7 = "too few arguments";
    local_1e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_1e8;
    while (pcVar6 = pcVar7, pcVar6 != "") {
      pcVar7 = pcVar6 + 1;
      if (*pcVar6 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar6 + 2;
      }
      else if (*pcVar6 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar6,"",(format_string_checker<char> *)&local_1e8);
      }
    }
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&local_1e8;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)&local_198,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args);
    this_01 = (string *)(local_58 + 8);
    local_58._0_4_ = kInvalidArgs;
    std::__cxx11::string::string(this_01,(string *)&local_198);
    Value::Value((Value *)&dataset,(Error *)local_58);
LAB_00120b16:
    Value::operator=(__return_storage_ptr__,(Value *)&dataset);
    Value::~Value((Value *)&dataset);
    std::__cxx11::string::~string(this_01);
    std::__cxx11::string::~string((string *)&local_198);
    return __return_storage_ptr__;
  }
  std::__cxx11::string::string((string *)&dataset,"get",(allocator *)&local_1e8);
  bVar4 = CaseInsensitiveEqual(pbVar2 + 1,(string *)&dataset);
  std::__cxx11::string::~string((string *)&dataset);
  if (bVar4) {
    dataset.mBorderAgentLocator = 0;
    dataset.mSessionId = 0;
    dataset.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dataset.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dataset.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mJoinerUdpPort = 0;
    dataset.mAeUdpPort = 0;
    dataset.mNmkpUdpPort = 0;
    dataset.mPresentFlags = 0;
    peVar3 = (aCommissioner->
             super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
    (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1b])
              (local_d0,peVar3,&dataset,0xffff);
    Value::Value(&local_1e8,(Error *)local_d0);
    pVVar5 = Value::operator=(__return_storage_ptr__,&local_1e8);
    EVar1 = (pVVar5->mError).mCode;
    Value::~Value(&local_1e8);
    std::__cxx11::string::~string((string *)(local_d0 + 8));
    if (EVar1 != kNone) goto LAB_00120e45;
    CommissionerDatasetToJson_abi_cxx11_(&local_140,(commissioner *)&dataset,aDataset);
    Value::Value(&local_1e8,&local_140);
    Value::operator=(__return_storage_ptr__,&local_1e8);
    Value::~Value(&local_1e8);
    this_00 = &local_140;
  }
  else {
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    std::__cxx11::string::string((string *)&dataset,"set",(allocator *)&local_1e8);
    bVar4 = CaseInsensitiveEqual(pbVar2 + 1,(string *)&dataset);
    std::__cxx11::string::~string((string *)&dataset);
    if (!bVar4) {
      local_1e8.mError.mCode = string_type;
      local_1e8.mError.mMessage._M_dataplus._M_p = "\'{}\' is not a valid sub-command";
      local_1e8.mError.mMessage._M_string_length = 0x1f;
      local_1e8.mError.mMessage.field_2._M_allocated_capacity = 0x100000000;
      local_1e8.mData._M_dataplus._M_p =
           (pointer)::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar7 = "\'{}\' is not a valid sub-command";
      local_1e8.mError.mMessage.field_2._8_8_ = (format_string_checker<char> *)&local_1e8;
      while (pcVar6 = pcVar7, pcVar6 != "") {
        pcVar7 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar6,"",(format_string_checker<char> *)&local_1e8);
        }
      }
      pbVar2 = (aExpr->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      local_1e8.mError._0_8_ = pbVar2[1]._M_dataplus._M_p;
      local_1e8.mError.mMessage._M_dataplus._M_p = (pointer)pbVar2[1]._M_string_length;
      fmt.size_ = 0xd;
      fmt.data_ = (char *)0x1f;
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_1e8;
      ::fmt::v10::vformat_abi_cxx11_
                ((string *)&local_198,(v10 *)"\'{}\' is not a valid sub-command",fmt,args_00);
      this_01 = (string *)(local_a8 + 8);
      local_a8._0_4_ = kInvalidCommand;
      std::__cxx11::string::string(this_01,(string *)&local_198);
      Value::Value((Value *)&dataset,(Error *)local_a8);
      goto LAB_00120b16;
    }
    dataset.mBorderAgentLocator = 0;
    dataset.mSessionId = 0;
    dataset.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    dataset.mSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dataset.mAeSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    dataset.mNmkpSteeringData.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    dataset.mJoinerUdpPort = 0;
    dataset.mAeUdpPort = 0;
    dataset.mNmkpUdpPort = 0;
    dataset.mPresentFlags = 0;
    pbVar2 = (aExpr->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(aExpr->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar2) < 0x41) {
      local_198.types_[0] = none_type;
      local_198.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "too few arguments";
      local_198.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x11;
      local_198.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_198.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_198.parse_funcs_[0] = (parse_func)0x0;
      pcVar7 = "too few arguments";
      local_198.context_.types_ = local_198.types_;
      while (pcVar6 = pcVar7, pcVar6 != "") {
        pcVar7 = pcVar6 + 1;
        if (*pcVar6 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar6 + 2;
        }
        else if (*pcVar6 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar6,"",&local_198);
        }
      }
      args_01.field_1.values_ = in_R9.values_;
      args_01.desc_ = (unsigned_long_long)&local_198;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_160,(v10 *)"too few arguments",(string_view)ZEXT816(0x11),args_01);
      local_80._0_4_ = kInvalidArgs;
      std::__cxx11::string::string((string *)(local_80 + 8),(string *)&local_160);
      Value::Value(&local_1e8,(Error *)local_80);
      Value::operator=(__return_storage_ptr__,&local_1e8);
      Value::~Value(&local_1e8);
      std::__cxx11::string::~string((string *)(local_80 + 8));
      this_00 = &local_160;
    }
    else {
      CommissionerDatasetFromJson((Error *)local_f8,&dataset,pbVar2 + 2);
      Value::Value(&local_1e8,(Error *)local_f8);
      pVVar5 = Value::operator=(__return_storage_ptr__,&local_1e8);
      EVar1 = (pVVar5->mError).mCode;
      Value::~Value(&local_1e8);
      std::__cxx11::string::~string((string *)(local_f8 + 8));
      if (EVar1 != kNone) goto LAB_00120e45;
      peVar3 = (aCommissioner->
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      (*(peVar3->super_CommissionerHandler)._vptr_CommissionerHandler[0x1c])
                (&local_120,peVar3,&dataset);
      Value::Value(&local_1e8,&local_120);
      Value::operator=(__return_storage_ptr__,&local_1e8);
      Value::~Value(&local_1e8);
      this_00 = &local_120.mMessage;
    }
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00120e45:
  CommissionerDataset::~CommissionerDataset(&dataset);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessCommDatasetJob(CommissionerAppPtr &aCommissioner, const Expression &aExpr)
{
    Value value;

    VerifyOrExit(aExpr.size() >= 2, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));

    if (CaseInsensitiveEqual(aExpr[1], "get"))
    {
        CommissionerDataset dataset;
        SuccessOrExit(value = aCommissioner->GetCommissionerDataset(dataset, 0xFFFF));
        value = CommissionerDatasetToJson(dataset);
    }
    else if (CaseInsensitiveEqual(aExpr[1], "set"))
    {
        CommissionerDataset dataset;
        VerifyOrExit(aExpr.size() >= 3, value = ERROR_INVALID_ARGS(SYNTAX_FEW_ARGS));
        SuccessOrExit(value = CommissionerDatasetFromJson(dataset, aExpr[2]));
        SuccessOrExit(value = aCommissioner->SetCommissionerDataset(dataset));
    }
    else
    {
        value = ERROR_INVALID_COMMAND(SYNTAX_INVALID_SUBCOMMAND, aExpr[1]);
    }

exit:
    return value;
}